

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

void print_name(flatcc_json_printer_t *ctx,char *name,size_t len)

{
  char *pcVar1;
  size_t sVar2;
  size_t __n;
  
  pcVar1 = ctx->p;
  if (ctx->indent == '\0') {
    if (ctx->pflush <= pcVar1) {
      (*ctx->flush)(ctx,0);
    }
  }
  else {
    ctx->p = pcVar1 + 1;
    *pcVar1 = '\n';
    sVar2 = (ulong)ctx->indent * (long)ctx->level;
    pcVar1 = ctx->p;
    if (ctx->pflush < pcVar1 + sVar2) {
      if (ctx->pflush <= pcVar1) {
        (*ctx->flush)(ctx,0);
      }
      __n = (long)ctx->pflush - (long)ctx->p;
      if (__n < sVar2) {
        do {
          memset(ctx->p,0x20,__n);
          ctx->p = ctx->p + __n;
          sVar2 = sVar2 - __n;
          (*ctx->flush)(ctx,0);
          __n = (long)ctx->pflush - (long)ctx->p;
        } while (__n < sVar2);
      }
      pcVar1 = ctx->p;
    }
    memset(pcVar1,0x20,sVar2);
    ctx->p = ctx->p + sVar2;
  }
  *ctx->p = '\"';
  pcVar1 = ctx->p + (ctx->unquote == '\0');
  ctx->p = pcVar1;
  if (ctx->pflush <= pcVar1 + len) {
    if (ctx->pflush <= pcVar1) {
      (*ctx->flush)(ctx,0);
    }
    sVar2 = (long)ctx->pflush - (long)ctx->p;
    if (sVar2 < len) {
      do {
        memcpy(ctx->p,name,sVar2);
        ctx->p = ctx->p + sVar2;
        name = name + sVar2;
        len = len - sVar2;
        (*ctx->flush)(ctx,0);
        sVar2 = (long)ctx->pflush - (long)ctx->p;
      } while (sVar2 < len);
    }
    pcVar1 = ctx->p;
  }
  memcpy(pcVar1,name,len);
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + len;
  pcVar1[len] = '\"';
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + (ctx->unquote == '\0') + 1;
  pcVar1[ctx->unquote == '\0'] = ':';
  *ctx->p = ' ';
  ctx->p = ctx->p + (ctx->indent != '\0');
  return;
}

Assistant:

static inline void print_name(flatcc_json_printer_t *ctx, const char *name, size_t len)
{
    print_nl();
    print_symbol(ctx, name, len);
    print_char(':');
    print_space();
}